

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::OptionParser::validateArgs(OptionParser *this,Command *args)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  ostringstream oss;
  allocator<char> local_1e1;
  string local_1e0 [32];
  undefined1 local_1c0 [40];
  ostringstream local_198 [376];
  
  uVar2 = (long)(args->m_args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->m_args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (((ulong)(long)this->m_minArgs <= uVar2) &&
     (((long)this->m_maxArgs < 0 || (uVar2 <= (ulong)(long)this->m_maxArgs)))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  if (this->m_maxArgs == -1) {
    poVar3 = std::operator<<((ostream *)local_198,"Expected at least ");
    iVar1 = this->m_minArgs;
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"argument",&local_1e1);
    local_1c0._0_8_ = (pointer)(long)iVar1;
    std::__cxx11::string::string((string *)(local_1c0 + 8),local_1e0);
    operator<<(poVar3,(pluralise *)local_1c0);
  }
  else {
    if (this->m_minArgs != this->m_maxArgs) {
      poVar3 = std::operator<<((ostream *)local_198,"Expected between ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_minArgs);
      poVar3 = std::operator<<(poVar3," and ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_maxArgs);
      std::operator<<(poVar3," argument");
      goto LAB_00136a29;
    }
    poVar3 = std::operator<<((ostream *)local_198,"Expected ");
    iVar1 = this->m_minArgs;
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"argument",&local_1e1);
    local_1c0._0_8_ = (pointer)(long)iVar1;
    std::__cxx11::string::string((string *)(local_1c0 + 8),local_1e0);
    operator<<(poVar3,(pluralise *)local_1c0);
  }
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string(local_1e0);
LAB_00136a29:
  std::__cxx11::stringbuf::str();
  Command::raiseError(args,(string *)local_1c0);
}

Assistant:

void validateArgs( const Command& args ) const {
            if(  tooFewArgs( args ) || tooManyArgs( args ) ) {
                std::ostringstream oss;
                if( m_maxArgs == -1 )
                    oss <<"Expected at least " << pluralise( static_cast<std::size_t>( m_minArgs ), "argument" );
                else if( m_minArgs == m_maxArgs )
                    oss <<"Expected " << pluralise( static_cast<std::size_t>( m_minArgs ), "argument" );
                else
                    oss <<"Expected between " << m_minArgs << " and " << m_maxArgs << " argument";
                args.raiseError( oss.str() );
            }
        }